

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeRTASBuilderBuildExt
          (ze_rtas_builder_ext_handle_t hBuilder,
          ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor,void *pScratchBuffer,
          size_t scratchBufferSizeBytes,void *pRtasBuffer,size_t rtasBufferSizeBytes,
          ze_rtas_parallel_operation_ext_handle_t hParallelOperation,void *pBuildUserPtr,
          ze_rtas_aabb_ext_t *pBounds,size_t *pRtasBufferSizeBytes)

{
  _func_void__ze_rtas_builder_build_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_rtas_builder_ext_handle_t_ptr__ze_rtas_builder_build_op_ext_desc_t_ptr_void_ptr_unsigned_long_void_ptr_unsigned_long__ze_rtas_parallel_operation_ext_handle_t_ptr_void_ptr__ze_rtas_aabb_ext_t_ptr_unsigned_long_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  char *pcVar3;
  ulong *puVar4;
  unsigned_long in_RCX;
  void *in_RDX;
  long lVar5;
  _ze_rtas_builder_build_op_ext_desc_t *in_RSI;
  _ze_rtas_builder_ext_handle_t *in_RDI;
  void *in_R8;
  unsigned_long in_R9;
  ulong uVar6;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000024;
  APITracerCallbackDataImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_rtas_builder_build_ext_params_t tracerParams;
  unsigned_long local_138;
  void *local_130;
  unsigned_long local_128;
  void *local_120;
  _ze_rtas_builder_build_op_ext_desc_t *local_118;
  _ze_rtas_builder_ext_handle_t *local_110;
  _func_void__ze_rtas_builder_build_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *local_108;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_100;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_e8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_d0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_b8;
  APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_a0;
  APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_90;
  _ze_rtas_builder_build_ext_params_t local_80;
  
  if (DAT_0017f140 ==
      (_func__ze_result_t__ze_rtas_builder_ext_handle_t_ptr__ze_rtas_builder_build_op_ext_desc_t_ptr_void_ptr_unsigned_long_void_ptr_unsigned_long__ze_rtas_parallel_operation_ext_handle_t_ptr_void_ptr__ze_rtas_aabb_ext_t_ptr_unsigned_long_ptr
       *)0x0) {
    _Var2 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_138 = in_R9;
    local_130 = in_R8;
    local_128 = in_RCX;
    local_120 = in_RDX;
    local_118 = in_RSI;
    local_110 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar3 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar3 == '\0') {
      tracing_layer::tracingInProgress::__tls_init();
      *pcVar3 = '\x01';
      local_80.phBuilder = &local_110;
      local_80.ppBuildOpDescriptor = &local_118;
      local_80.ppScratchBuffer = &local_120;
      local_80.pscratchBufferSizeBytes = &local_128;
      local_80.ppRtasBuffer = &local_130;
      local_80.prtasBufferSizeBytes = &local_138;
      local_80.phParallelOperation = (ze_rtas_parallel_operation_ext_handle_t *)&stack0x00000008;
      local_80.ppBuildUserPtr = (void **)&stack0x00000010;
      local_80.ppBounds = (ze_rtas_aabb_ext_t **)&stack0x00000018;
      local_80.ppRtasBufferSizeBytes = (size_t **)&stack0x00000020;
      local_e8.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      vStack_100.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      vStack_100.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      local_108 = (_func_void__ze_rtas_builder_build_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   *)0x0;
      vStack_100.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if ((puVar4 != (ulong *)0x0) && (*puVar4 != 0)) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          local_90.current_api_callback =
               *(_func_void__ze_rtas_builder_build_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0x20 + lVar5);
          p_Var1 = *(_func_void__ze_rtas_builder_build_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + 0x678 + lVar5);
          local_90.pUserData = *(void **)(puVar4[1] + 0xcb0 + lVar5);
          if (vStack_100.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vStack_100.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>>>
                        *)&vStack_100,
                       (iterator)
                       vStack_100.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_90);
          }
          else {
            (vStack_100.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
                 local_90.current_api_callback;
            (vStack_100.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_90.pUserData;
            vStack_100.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_100.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_a0.pUserData = *(void **)(puVar4[1] + 0xcb0 + lVar5);
          local_a0.current_api_callback = p_Var1;
          if (local_e8.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_e8.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>>>
                        *)&local_e8,
                       (iterator)
                       local_e8.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
          }
          else {
            (local_e8.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
            (local_e8.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_a0.pUserData;
            local_e8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_e8.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0xcb8;
        } while (uVar6 < *puVar4);
      }
      p_Var1 = local_108;
      zeApiPtr = DAT_0017f140;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_b8,&vStack_100);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_d0,&local_e8);
      _Var2 = APITracerWrapperImp<_ze_result_t(*)(_ze_rtas_builder_ext_handle_t*,_ze_rtas_builder_build_op_ext_desc_t_const*,void*,unsigned_long,void*,unsigned_long,_ze_rtas_parallel_operation_ext_handle_t*,void*,_ze_rtas_aabb_ext_t*,unsigned_long*),_ze_rtas_builder_build_ext_params_t*,void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_builder_build_ext_params_t*,_ze_result_t,void*,void**)>>>,_ze_rtas_builder_ext_handle_t*&,_ze_rtas_builder_build_op_ext_desc_t_const*&,void*&,unsigned_long&,void*&,unsigned_long&,_ze_rtas_parallel_operation_ext_handle_t*&,void*&,_ze_rtas_aabb_ext_t*&,unsigned_long*&>
                        (zeApiPtr,&local_80,p_Var1,&local_b8,&local_d0,local_80.phBuilder,
                         local_80.ppBuildOpDescriptor,local_80.ppScratchBuffer,
                         local_80.pscratchBufferSizeBytes,local_80.ppRtasBuffer,
                         local_80.prtasBufferSizeBytes,local_80.phParallelOperation,
                         local_80.ppBuildUserPtr,local_80.ppBounds,local_80.ppRtasBufferSizeBytes);
      if (local_d0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (vStack_100.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_100.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_100.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_100.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_builder_build_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      _Var2 = (*DAT_0017f140)(local_110,local_118,local_120,local_128,local_130,local_138,
                              (_ze_rtas_parallel_operation_ext_handle_t *)
                              CONCAT44(in_stack_0000000c,in_stack_00000008),
                              (void *)CONCAT44(in_stack_00000014,in_stack_00000010),
                              (_ze_rtas_aabb_ext_t *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                              (unsigned_long *)CONCAT44(in_stack_00000024,in_stack_00000020));
    }
  }
  return _Var2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderBuildExt(
        ze_rtas_builder_ext_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_ext_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        void* pScratchBuffer,                           ///< [in][range(0, `scratchBufferSizeBytes`)] scratch buffer to be used
                                                        ///< during acceleration structure construction
        size_t scratchBufferSizeBytes,                  ///< [in] size of scratch buffer, in bytes
        void* pRtasBuffer,                              ///< [in] pointer to destination buffer
        size_t rtasBufferSizeBytes,                     ///< [in] destination buffer size, in bytes
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation, ///< [in][optional] handle to parallel operation object
        void* pBuildUserPtr,                            ///< [in][optional] pointer passed to callbacks
        ze_rtas_aabb_ext_t* pBounds,                    ///< [in,out][optional] pointer to destination address for acceleration
                                                        ///< structure bounds
        size_t* pRtasBufferSizeBytes                    ///< [out][optional] updated acceleration structure size requirement, in
                                                        ///< bytes
        )
    {
        auto pfnBuildExt = context.zeDdiTable.RTASBuilder.pfnBuildExt;

        if( nullptr == pfnBuildExt)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.RTASBuilder.pfnBuildExt, hBuilder, pBuildOpDescriptor, pScratchBuffer, scratchBufferSizeBytes, pRtasBuffer, rtasBufferSizeBytes, hParallelOperation, pBuildUserPtr, pBounds, pRtasBufferSizeBytes);

        // capture parameters
        ze_rtas_builder_build_ext_params_t tracerParams = {
            &hBuilder,
            &pBuildOpDescriptor,
            &pScratchBuffer,
            &scratchBufferSizeBytes,
            &pRtasBuffer,
            &rtasBufferSizeBytes,
            &hParallelOperation,
            &pBuildUserPtr,
            &pBounds,
            &pRtasBufferSizeBytes
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnRTASBuilderBuildExtCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnRTASBuilderBuildExtCb_t, RTASBuilder, pfnBuildExtCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.RTASBuilder.pfnBuildExt,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phBuilder,
                                                  *tracerParams.ppBuildOpDescriptor,
                                                  *tracerParams.ppScratchBuffer,
                                                  *tracerParams.pscratchBufferSizeBytes,
                                                  *tracerParams.ppRtasBuffer,
                                                  *tracerParams.prtasBufferSizeBytes,
                                                  *tracerParams.phParallelOperation,
                                                  *tracerParams.ppBuildUserPtr,
                                                  *tracerParams.ppBounds,
                                                  *tracerParams.ppRtasBufferSizeBytes);
    }